

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

void print_final_tree_recur(FILE *fp,dtree_node_t *node,pset_t *pset)

{
  while( true ) {
    if (node->y == (dtree_node_str *)0x0 && node->n == (dtree_node_str *)0x0) break;
    fprintf((FILE *)fp,"%u %u %u %e %e ",node->wt_ent_dec,(double)(float)node->occ,
            (ulong)node->node_id,(ulong)node->y->node_id,(ulong)node->n->node_id);
    print_comp_quest(fp,pset,(comp_quest_t *)node->q);
    fputc(10,(FILE *)fp);
    print_final_tree_recur(fp,node->y,pset);
    node = node->n;
  }
  fprintf((FILE *)fp,"%u - - %e %e\n",node->wt_ent,(double)(float)node->occ,(ulong)node->node_id);
  return;
}

Assistant:

static void
print_final_tree_recur(FILE *fp,
		       dtree_node_t *node,
		       pset_t *pset)
{
    if (!IS_LEAF(node)) {
	fprintf(fp, "%u %u %u %e %e ",
		node->node_id, node->y->node_id, node->n->node_id, node->wt_ent_dec, node->occ);
	print_comp_quest(fp, pset, (comp_quest_t *)node->q);
	fprintf(fp, "\n");

	print_final_tree_recur(fp, node->y, pset);
	print_final_tree_recur(fp, node->n, pset);
    }
    else {
	fprintf(fp, "%u - - %e %e\n",
		node->node_id, node->wt_ent, node->occ);
    }
}